

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int rect_height_compare(void *a,void *b)

{
  undefined4 local_2c;
  stbrp_rect *q;
  stbrp_rect *p;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*(ushort *)((long)b + 6) < *(ushort *)((long)a + 6)) {
    local_4 = 0xffffffff;
  }
  else if (*(ushort *)((long)a + 6) < *(ushort *)((long)b + 6)) {
    local_4 = 1;
  }
  else {
    if (*(ushort *)((long)b + 4) < *(ushort *)((long)a + 4)) {
      local_2c = 0xffffffff;
    }
    else {
      local_2c = (uint)(*(ushort *)((long)a + 4) < *(ushort *)((long)b + 4));
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int STBRP__CDECL rect_height_compare(const void *a, const void *b)
{
   const stbrp_rect *p = (const stbrp_rect *) a;
   const stbrp_rect *q = (const stbrp_rect *) b;
   if (p->h > q->h)
      return -1;
   if (p->h < q->h)
      return  1;
   return (p->w > q->w) ? -1 : (p->w < q->w);
}